

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void Imf_3_3::anon_unknown_1::initialize
               (Header *header,Box2i *displayWindow,Box2i *dataWindow,float pixelAspectRatio,
               V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder,
               Compression compression)

{
  bool bVar1;
  undefined8 uVar2;
  TypedAttribute<Imf_3_3::ChannelList> *in_RDI;
  float in_XMM0_Da;
  stringstream _iex_throw_s;
  Attribute *in_stack_000002d0;
  char *in_stack_000002d8;
  undefined4 in_stack_000002e0;
  Box<Imath_3_1::Vec2<int>_> *in_stack_fffffffffffffce8;
  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_> *in_stack_fffffffffffffcf0;
  stringstream local_200 [16];
  ostream local_1f0 [468];
  float local_1c;
  TypedAttribute<Imf_3_3::ChannelList> *local_8;
  
  local_1c = in_XMM0_Da;
  local_8 = in_RDI;
  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_>::TypedAttribute
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                 in_stack_000002d0);
  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_>::~TypedAttribute
            ((TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_> *)0x122021);
  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_>::TypedAttribute
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                 in_stack_000002d0);
  TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_>::~TypedAttribute
            ((TypedAttribute<Imath_3_1::Box<Imath_3_1::Vec2<int>_>_> *)0x12206d);
  bVar1 = std::isnormal(local_1c);
  if ((bVar1) && (0.0 <= local_1c)) {
    TypedAttribute<float>::TypedAttribute
              ((TypedAttribute<float> *)in_stack_fffffffffffffcf0,(float *)in_stack_fffffffffffffce8
              );
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)0x1221db);
    TypedAttribute<Imath_3_1::Vec2<float>_>::TypedAttribute
              ((TypedAttribute<Imath_3_1::Vec2<float>_> *)in_stack_fffffffffffffcf0,
               (Vec2<float> *)in_stack_fffffffffffffce8);
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<Imath_3_1::Vec2<float>_>::~TypedAttribute
              ((TypedAttribute<Imath_3_1::Vec2<float>_> *)0x122227);
    TypedAttribute<float>::TypedAttribute
              ((TypedAttribute<float> *)in_stack_fffffffffffffcf0,(float *)in_stack_fffffffffffffce8
              );
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)0x122273);
    TypedAttribute<Imf_3_3::LineOrder>::TypedAttribute
              ((TypedAttribute<Imf_3_3::LineOrder> *)in_stack_fffffffffffffcf0,
               (LineOrder *)in_stack_fffffffffffffce8);
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<Imf_3_3::LineOrder>::~TypedAttribute
              ((TypedAttribute<Imf_3_3::LineOrder> *)0x1222bf);
    TypedAttribute<Imf_3_3::Compression>::TypedAttribute
              ((TypedAttribute<Imf_3_3::Compression> *)in_stack_fffffffffffffcf0,
               (Compression *)in_stack_fffffffffffffce8);
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<Imf_3_3::Compression>::~TypedAttribute
              ((TypedAttribute<Imf_3_3::Compression> *)0x12230b);
    TypedAttribute<Imf_3_3::ChannelList>::TypedAttribute(local_8);
    Header::insert((Header *)CONCAT44(compression,in_stack_000002e0),in_stack_000002d8,
                   in_stack_000002d0);
    TypedAttribute<Imf_3_3::ChannelList>::~TypedAttribute(local_8);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_200);
  std::operator<<(local_1f0,"Invalid pixel aspect ratio");
  uVar2 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc
            ((ArgExc *)in_stack_fffffffffffffcf0,(stringstream *)in_stack_fffffffffffffce8);
  __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
initialize (
    Header&      header,
    const Box2i& displayWindow,
    const Box2i& dataWindow,
    float        pixelAspectRatio,
    const V2f&   screenWindowCenter,
    float        screenWindowWidth,
    LineOrder    lineOrder,
    Compression  compression)
{
    header.insert ("displayWindow", Box2iAttribute (displayWindow));
    header.insert ("dataWindow", Box2iAttribute (dataWindow));
    if (!std::isnormal (pixelAspectRatio) || pixelAspectRatio < 0.f)
        THROW (IEX_NAMESPACE::ArgExc, "Invalid pixel aspect ratio");
    header.insert ("pixelAspectRatio", FloatAttribute (pixelAspectRatio));
    header.insert ("screenWindowCenter", V2fAttribute (screenWindowCenter));
    header.insert ("screenWindowWidth", FloatAttribute (screenWindowWidth));
    header.insert ("lineOrder", LineOrderAttribute (lineOrder));
    header.insert ("compression", CompressionAttribute (compression));
    header.insert ("channels", ChannelListAttribute ());
}